

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t BIT_initDStream(BIT_DStream_t *bitD,void *srcBuffer,size_t srcSize)

{
  byte bVar1;
  size_t *psVar2;
  uint uVar3;
  
  if (srcSize == 0) {
    bitD->ptr = (char *)0x0;
    bitD->start = (char *)0x0;
    bitD->bitContainer = 0;
    *(undefined8 *)&bitD->bitsConsumed = 0;
    bitD->limitPtr = (char *)0x0;
    return 0xffffffffffffffb8;
  }
  bitD->start = (char *)srcBuffer;
  bitD->limitPtr = (char *)((long)srcBuffer + 8);
  if (7 < srcSize) {
    psVar2 = (size_t *)((long)srcBuffer + (srcSize - 8));
    bitD->ptr = (char *)psVar2;
    bitD->bitContainer = *psVar2;
    bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
    uVar3 = 0x1f;
    if (bVar1 != 0) {
      for (; bVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = ~uVar3 + 9;
    if (bVar1 == 0) {
      uVar3 = 0;
    }
    bitD->bitsConsumed = uVar3;
    if (bVar1 == 0) {
      return 0xffffffffffffffff;
    }
    return srcSize;
  }
  bitD->ptr = (char *)srcBuffer;
  bVar1 = *srcBuffer;
  bitD->bitContainer = (ulong)bVar1;
  switch(srcSize) {
  case 7:
    bitD->bitContainer = (ulong)*(byte *)((long)srcBuffer + 6) << 0x30 | (ulong)bVar1;
  case 6:
    bitD->bitContainer = bitD->bitContainer + ((ulong)*(byte *)((long)srcBuffer + 5) << 0x28);
  case 5:
    bitD->bitContainer = bitD->bitContainer + ((ulong)*(byte *)((long)srcBuffer + 4) << 0x20);
  case 4:
    bitD->bitContainer = bitD->bitContainer + (ulong)*(byte *)((long)srcBuffer + 3) * 0x1000000;
  case 3:
    bitD->bitContainer = bitD->bitContainer + (ulong)*(byte *)((long)srcBuffer + 2) * 0x10000;
  case 2:
    bitD->bitContainer = bitD->bitContainer + (ulong)*(byte *)((long)srcBuffer + 1) * 0x100;
  }
  bVar1 = *(byte *)((long)srcBuffer + (srcSize - 1));
  uVar3 = 0x1f;
  if (bVar1 != 0) {
    for (; bVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = ~uVar3 + 9;
  if (bVar1 == 0) {
    uVar3 = 0;
  }
  bitD->bitsConsumed = uVar3;
  if (bVar1 == 0) {
    return 0xffffffffffffffec;
  }
  bitD->bitsConsumed = uVar3 + (int)srcSize * -8 + 0x40;
  return srcSize;
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { ZSTD_memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                ZSTD_FALLTHROUGH;

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                ZSTD_FALLTHROUGH;

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                ZSTD_FALLTHROUGH;

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                ZSTD_FALLTHROUGH;

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                ZSTD_FALLTHROUGH;

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                ZSTD_FALLTHROUGH;

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - ZSTD_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}